

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubeMap.cpp
# Opt level: O2

void __thiscall CubeMap::CubeMap(CubeMap *this,string *directory)

{
  long lVar1;
  string filename;
  string side [6];
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  undefined1 local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [40];
  
  memset(this,0,0xc0);
  std::__cxx11::string::string((string *)&local_f8,"left",(allocator *)&local_118);
  std::__cxx11::string::string(local_d8,"right",(allocator *)local_158);
  std::__cxx11::string::string(local_b8,"up",(allocator *)&local_138);
  std::__cxx11::string::string(local_98,"down",&local_159);
  std::__cxx11::string::string(local_78,"front",&local_15a);
  std::__cxx11::string::string(local_58,"back",&local_15b);
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x20) {
    std::operator+(&local_138,directory,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&local_f8._M_dataplus._M_p + lVar1));
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   ".png");
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)&local_138);
    Image::loadPNG((Image *)local_158,&local_118);
    Image::operator=((Image *)((long)&this->_images[0]._width + lVar1),(Image *)local_158);
    std::_Vector_base<Vector3f,_std::allocator<Vector3f>_>::~_Vector_base
              ((_Vector_base<Vector3f,_std::allocator<Vector3f>_> *)(local_158 + 8));
    std::__cxx11::string::~string((string *)&local_118);
  }
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f8._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

CubeMap::CubeMap(const std::string &directory) {
    std::string side[6] = {"left", "right", "up", "down", "front", "back"};
    for (int ii = 0; ii < 6; ii++) {
        std::string filename = directory + "/" + side[ii] + ".png";
        _images[ii] = Image::loadPNG(filename);
    }

}